

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlkem_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_392279::MLKEMTest_PWCT_Test::TestBody(MLKEMTest_PWCT_Test *this)

{
  bool bVar1;
  pointer puVar2;
  pointer out_private_key;
  char *pcVar3;
  pointer out_private_key_00;
  AssertHelper local_98;
  Message local_90;
  bcm_status_t local_88;
  bcm_status local_84;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_1;
  __single_object priv1024;
  __array pub1024;
  AssertHelper local_58;
  Message local_50;
  bcm_status_t local_48;
  bcm_status local_44;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  unique_ptr<BCM_mlkem768_private_key,_std::default_delete<BCM_mlkem768_private_key>_> local_20;
  __single_object priv768;
  __array pub768;
  MLKEMTest_PWCT_Test *this_local;
  
  std::make_unique<unsigned_char[]>((size_t)&priv768);
  std::make_unique<BCM_mlkem768_private_key>();
  puVar2 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                     ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&priv768
                     );
  out_private_key =
       std::unique_ptr<BCM_mlkem768_private_key,_std::default_delete<BCM_mlkem768_private_key>_>::
       get(&local_20);
  local_44 = BCM_mlkem768_generate_key_fips(puVar2,(uint8_t *)0x0,out_private_key);
  local_48 = approved;
  testing::internal::EqHelper::Compare<bcm_status_t,_bcm_status_t,_nullptr>
            ((EqHelper *)local_40,
             "BCM_mlkem768_generate_key_fips(pub768.get(), nullptr, priv768.get())",
             "bcm_status::approved",&local_44,&local_48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(&local_50);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mlkem/mlkem_test.cc"
               ,0x21a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_58,&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::Message::~Message(&local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  if (bVar1) {
    std::make_unique<unsigned_char[]>((size_t)&priv1024);
    std::make_unique<BCM_mlkem1024_private_key>();
    puVar2 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                       ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                        &priv1024);
    out_private_key_00 =
         std::unique_ptr<BCM_mlkem1024_private_key,_std::default_delete<BCM_mlkem1024_private_key>_>
         ::get((unique_ptr<BCM_mlkem1024_private_key,_std::default_delete<BCM_mlkem1024_private_key>_>
                *)&gtest_ar_1.message_);
    local_84 = BCM_mlkem1024_generate_key_fips(puVar2,(uint8_t *)0x0,out_private_key_00);
    local_88 = approved;
    testing::internal::EqHelper::Compare<bcm_status_t,_bcm_status_t,_nullptr>
              ((EqHelper *)local_80,
               "BCM_mlkem1024_generate_key_fips(pub1024.get(), nullptr, priv1024.get())",
               "bcm_status::approved",&local_84,&local_88);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
    if (!bVar1) {
      testing::Message::Message(&local_90);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mlkem/mlkem_test.cc"
                 ,0x220,pcVar3);
      testing::internal::AssertHelper::operator=(&local_98,&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      testing::Message::~Message(&local_90);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
    std::unique_ptr<BCM_mlkem1024_private_key,_std::default_delete<BCM_mlkem1024_private_key>_>::
    ~unique_ptr((unique_ptr<BCM_mlkem1024_private_key,_std::default_delete<BCM_mlkem1024_private_key>_>
                 *)&gtest_ar_1.message_);
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
              ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&priv1024);
  }
  std::unique_ptr<BCM_mlkem768_private_key,_std::default_delete<BCM_mlkem768_private_key>_>::
  ~unique_ptr(&local_20);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&priv768);
  return;
}

Assistant:

TEST(MLKEMTest, PWCT) {
  auto pub768 = std::make_unique<uint8_t[]>(BCM_MLKEM768_PUBLIC_KEY_BYTES);
  auto priv768 = std::make_unique<BCM_mlkem768_private_key>();
  ASSERT_EQ(
      BCM_mlkem768_generate_key_fips(pub768.get(), nullptr, priv768.get()),
      bcm_status::approved);

  auto pub1024 = std::make_unique<uint8_t[]>(BCM_MLKEM1024_PUBLIC_KEY_BYTES);
  auto priv1024 = std::make_unique<BCM_mlkem1024_private_key>();
  ASSERT_EQ(
      BCM_mlkem1024_generate_key_fips(pub1024.get(), nullptr, priv1024.get()),
      bcm_status::approved);
}